

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O1

void __thiscall
helics::apps::AsioBrokerServer::processArgs(AsioBrokerServer *this,string_view param_1)

{
  return;
}

Assistant:

void AsioBrokerServer::processArgs(std::string_view /*unused*/)

    {
        /*
         CLI::App parser("Asio broker server CLI parser");
         parser.allow_extras();
         parser.add_option("--tcp_port", tcpPort_, "specify the tcp port to use");
         parser.add_option("--tcp_interface",
                           tcpAddress_,
                           "specify the interface to use for connecting the tcp server");

         parser.add_option("--udp_port", udpPort_, "specify the udp port to use");
         parser.add_option("--udp_interface",
                           udpAddress_,
                           "specify the interface to use for connecting a udp server");

         try {
             parser.parse(args);
         }
         catch (const CLI::Error& ce) {
             logMessage(std::string("error processing command line arguments for asio broker server
         :") + ce.what());
         }
         */
    }